

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chorus.cpp
# Opt level: O1

void anon_unknown.dwarf_13a68a::Flanger_getParamf(EffectProps *props,ALenum param,float *val)

{
  effect_exception *this;
  
  if (param - 3U < 4) {
    *val = *(float *)((long)props + (ulong)(param - 3U) * 4 + 8);
    return;
  }
  this = (effect_exception *)__cxa_allocate_exception(0x30);
  effect_exception::effect_exception
            (this,0xa002,"Invalid flanger float property 0x%04x",(ulong)(uint)param);
  __cxa_throw(this,&effect_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void Flanger_getParamf(const EffectProps *props, ALenum param, float *val)
{
    switch(param)
    {
    case AL_FLANGER_RATE:
        *val = props->Chorus.Rate;
        break;

    case AL_FLANGER_DEPTH:
        *val = props->Chorus.Depth;
        break;

    case AL_FLANGER_FEEDBACK:
        *val = props->Chorus.Feedback;
        break;

    case AL_FLANGER_DELAY:
        *val = props->Chorus.Delay;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid flanger float property 0x%04x", param};
    }
}